

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.h
# Opt level: O1

uchar * append_uint32(uchar *cp,uint32_t i)

{
  uint uVar1;
  ulong uVar2;
  char cVar3;
  
  if (i == 0) {
    *cp = '0';
LAB_00146ed3:
    return cp + 1;
  }
  if (i < 100) {
    if (i < 10) {
      *cp = (byte)i | 0x30;
      goto LAB_00146ed3;
    }
    *cp = (byte)(i / 10) | 0x30;
    cVar3 = (byte)i + (char)(i / 10) * -10;
    goto LAB_00147117;
  }
  if (i < 10000) {
    if (999 < i) {
      *cp = (char)(i / 1000) + '0';
      uVar1 = i % 1000;
      goto LAB_001470df;
    }
    *cp = (byte)(i / 100) | 0x30;
    cp = cp + 1;
    uVar1 = i % 100;
  }
  else {
    if (i < 1000000) {
      if (99999 < i) {
        *cp = (byte)((ulong)(i >> 5) / 0xc35) | 0x30;
        uVar1 = ((i >> 5) / 0xc35) * -100000 + i;
        goto LAB_001470a3;
      }
      *cp = (byte)(i / 10000) | 0x30;
      cp = cp + 1;
      uVar1 = i % 10000;
    }
    else {
      if (i < 100000000) {
        if (9999999 < i) {
          *cp = (byte)(i / 10000000) | 0x30;
          uVar1 = i % 10000000;
          goto LAB_00147065;
        }
        *cp = (char)(i / 1000000) + '0';
        cp = cp + 1;
        uVar1 = i % 1000000;
      }
      else {
        if (i < 1000000000) {
          *cp = (byte)(i / 100000000) | 0x30;
          cp = cp + 1;
          uVar1 = i % 100000000;
        }
        else {
          uVar2 = (ulong)(i >> 9) * 0x44b83;
          *cp = (byte)(uVar2 >> 0x27) | 0x30;
          uVar1 = (uint)(uVar2 >> 0x27) * -1000000000 + i;
          cp[1] = (char)(uVar1 / 100000000) + '0';
          cp = cp + 2;
          uVar1 = uVar1 % 100000000;
        }
        *cp = (char)(uVar1 / 10000000) + '0';
        uVar1 = uVar1 % 10000000;
LAB_00147065:
        cp[1] = (char)(uVar1 / 1000000) + '0';
        cp = cp + 2;
        uVar1 = uVar1 % 1000000;
      }
      *cp = (char)((uVar1 >> 5) / 0xc35) + '0';
      uVar1 = uVar1 + ((uVar1 >> 5) / 0xc35) * -100000;
LAB_001470a3:
      cp[1] = (char)(uVar1 / 10000) + '0';
      cp = cp + 2;
      uVar1 = uVar1 % 10000;
    }
    *cp = (char)(uVar1 / 1000) + '0';
    uVar1 = uVar1 % 1000;
LAB_001470df:
    cp[1] = (char)(uVar1 / 100) + '0';
    cp = cp + 2;
    uVar1 = uVar1 % 100;
  }
  *cp = (char)(uVar1 / 10) + '0';
  cVar3 = (char)uVar1 + (char)(uVar1 / 10) * -10;
LAB_00147117:
  cp[1] = cVar3 + '0';
  return cp + 2;
}

Assistant:

static inline unsigned char *append_uint32(unsigned char *cp, uint32_t i) {
    uint32_t j;

    if (i == 0) {
	*cp++ = '0';
	return cp;
    }

    if (i < 100)        goto b1;
    if (i < 10000)      goto b3;
    if (i < 1000000)    goto b5;
    if (i < 100000000)  goto b7;

    if ((j = i / 1000000000)) {*cp++ = j + '0'; i -= j*1000000000; goto x8;}
    if ((j = i / 100000000))  {*cp++ = j + '0'; i -= j*100000000;  goto x7;}
 b7:if ((j = i / 10000000))   {*cp++ = j + '0'; i -= j*10000000;   goto x6;}
    if ((j = i / 1000000))    {*cp++ = j + '0', i -= j*1000000;    goto x5;}
 b5:if ((j = i / 100000))     {*cp++ = j + '0', i -= j*100000;     goto x4;}
    if ((j = i / 10000))      {*cp++ = j + '0', i -= j*10000;      goto x3;}
 b3:if ((j = i / 1000))       {*cp++ = j + '0', i -= j*1000;       goto x2;}
    if ((j = i / 100))        {*cp++ = j + '0', i -= j*100;        goto x1;}
 b1:if ((j = i / 10))         {*cp++ = j + '0', i -= j*10;         goto x0;}
    if (i)                     *cp++ = i + '0';
    return cp;

 x8: *cp++ = i / 100000000 + '0', i %= 100000000;
 x7: *cp++ = i / 10000000  + '0', i %= 10000000;
 x6: *cp++ = i / 1000000   + '0', i %= 1000000;
 x5: *cp++ = i / 100000    + '0', i %= 100000;
 x4: *cp++ = i / 10000     + '0', i %= 10000;
 x3: *cp++ = i / 1000      + '0', i %= 1000;
 x2: *cp++ = i / 100       + '0', i %= 100;
 x1: *cp++ = i / 10        + '0', i %= 10;
 x0: *cp++ = i             + '0';

    return cp;
}